

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_handle.cpp
# Opt level: O2

vector<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
* __thiscall
libtorrent::torrent_handle::
sync_call_ret<std::vector<std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>,std::allocator<std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>>>,std::vector<std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>,std::allocator<std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>>>(libtorrent::aux::torrent::*)()const>
          (vector<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
           *__return_storage_ptr__,torrent_handle *this,
          vector<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
          *def,offset_in_torrent_to_subr f)

{
  session_impl *ses;
  io_context *ctx;
  undefined8 uVar1;
  bool done;
  exception_ptr ex;
  shared_ptr<libtorrent::aux::torrent> t;
  bool local_91;
  exception_ptr local_90;
  __shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> local_88;
  exception_ptr local_78;
  type_conflict10 local_70;
  
  ::std::__shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_88)
  ;
  ::std::
  vector<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
  ::vector(__return_storage_ptr__,def);
  if (local_88._M_ptr == (element_type *)0x0) {
    throw_invalid_handle();
  }
  ses = (session_impl *)((local_88._M_ptr)->super_torrent_hot_members).m_ses;
  local_70.ex = &local_90;
  local_90._M_exception_object = (void *)0x0;
  local_70.done = &local_91;
  local_91 = false;
  ctx = ses->m_io_context;
  local_70.r = __return_storage_ptr__;
  local_70.ses = ses;
  ::std::__shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_70.t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>,
             &local_88);
  local_70.f = f;
  boost::asio::
  dispatch<boost::asio::io_context,libtorrent::torrent_handle::sync_call_ret<std::vector<std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>,std::allocator<std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>>>,std::vector<std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>,std::allocator<std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>>>(libtorrent::aux::torrent::*)()const>(std::vector<std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>,std::allocator<std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>>>,std::vector<std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>,std::allocator<std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>>>(libtorrent::aux::torrent::*)()const)const::_lambda()_1_>
            (ctx,&local_70,(type *)0x0);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_70.t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  aux::torrent_wait(&local_91,ses);
  if (local_90._M_exception_object == (void *)0x0) {
    ::std::__exception_ptr::exception_ptr::~exception_ptr(&local_90);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88._M_refcount);
    return __return_storage_ptr__;
  }
  ::std::__exception_ptr::exception_ptr::exception_ptr(&local_78,&local_90);
  uVar1 = ::std::rethrow_exception((exception_ptr)&local_78);
  ::std::__exception_ptr::exception_ptr::~exception_ptr(&local_78);
  ::std::__exception_ptr::exception_ptr::~exception_ptr(&local_90);
  ::std::
  vector<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
  ::~vector(__return_storage_ptr__);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88._M_refcount);
  _Unwind_Resume(uVar1);
}

Assistant:

Ret torrent_handle::sync_call_ret(Ret def, Fun f, Args&&... a) const
	{
		auto t = m_torrent.lock();
		Ret r = def;
#ifndef BOOST_NO_EXCEPTIONS
		if (!t) throw_invalid_handle();
#else
		if (!t) return r;
#endif
		auto& ses = static_cast<session_impl&>(t->session());

		// this is the flag to indicate the call has completed
		bool done = false;

		std::exception_ptr ex;
		dispatch(ses.get_context(), [=,&r,&done,&ses,&ex] ()
		{
#ifndef BOOST_NO_EXCEPTIONS
			try {
#endif
				r = (t.get()->*f)(std::move(a)...);
#ifndef BOOST_NO_EXCEPTIONS
			} catch (...) {
				ex = std::current_exception();
			}
#endif
			std::unique_lock<std::mutex> l(ses.mut);
			done = true;
			ses.cond.notify_all();
		} );

		aux::torrent_wait(done, ses);

		if (ex) std::rethrow_exception(ex);
		return r;
	}